

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

SolveResult __thiscall Board::backtrack(Board *this,tile_index index,SolveResult *result)

{
  pointer pTVar1;
  bool bVar2;
  SolveResult SVar3;
  ulong uVar4;
  ulong uVar5;
  TileValue TVar6;
  tile_index index_local;
  
  pTVar1 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar2 = true;
  if ((long)(this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar1 >> 3 != (ulong)index) {
    index_local = index;
    if (pTVar1[index].status == Solved) {
      SVar3 = backtrack(this,index + 1,result);
      if (((ulong)SVar3 >> 0x20 & 1) != 0) {
        uVar4 = (ulong)SVar3 >> 0x20;
        uVar5 = 0;
        goto LAB_00104c4f;
      }
    }
    else {
      uVar5 = 0;
      for (TVar6 = One; TVar6 - One < this->SIZE; TVar6 = TVar6 + One) {
        pTVar1 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar1[index_local].value = TVar6;
        pTVar1[index_local].status = Processing;
        bVar2 = isTileInsertionValid(this,&index_local);
        if (bVar2) {
          SVar3 = backtrack(this,index_local + 1,result);
          if (((ulong)SVar3 >> 0x20 & 1) != 0) {
            uVar4 = (ulong)SVar3 >> 0x20;
            goto LAB_00104c4f;
          }
        }
      }
      pTVar1 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
               super__Vector_impl_data._M_start + index_local;
      pTVar1->value = Empty;
      pTVar1->status = Empty;
    }
    result->backtracks = result->backtracks + 1;
    bVar2 = false;
  }
  result->solved = bVar2;
  uVar4 = (ulong)bVar2;
  SVar3.solved = bVar2;
  SVar3.backtracks = result->backtracks;
  SVar3._5_3_ = 0;
  uVar5 = (ulong)(byte)result->field_0x7 << 0x38 | (ulong)*(ushort *)&result->field_0x5 << 0x28;
LAB_00104c4f:
  return (SolveResult)((ulong)SVar3 & 0xffffffff | (uVar4 & 0xff) << 0x20 | uVar5);
}

Assistant:

SolveResult Board::backtrack(tile_index index, SolveResult &result)
{
	if (index == _tiles.size())
	{
		result.solved = true;
		return result;
	}

	if (_tiles[index].status != TileStatus::Solved)
	{
		for (unsigned int i = 0; i < Board::SIZE; ++i)
		{
			_tiles[index].value = (TileValue)(i + 1);
			_tiles[index].status = TileStatus::Processing;

			if (isTileInsertionValid(index))
			{
				auto r = backtrack(index + 1, result);
				if (r.solved)
					return r;
			}
		}

		_tiles[index].value = TileValue::Empty;
		_tiles[index].status = TileStatus::Empty;
	}
	else
	{
		auto r = backtrack(index + 1, result);
		if (r.solved)
			return r;
	}

	++result.backtracks;
	result.solved = false;
	return result;
}